

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

TParameter * __thiscall glslang::TParameter::copyParam(TParameter *this,TParameter *param)

{
  int iVar1;
  TPoolAllocator *in_RAX;
  TPoolAllocator *this_00;
  TString *this_01;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  void *extraout_RDX;
  TParameter *__fn;
  void *in_R8;
  pool_allocator<char> local_28;
  
  if (param->name == (TString *)0x0) {
    this_01 = (TString *)0x0;
    __fn = param;
    local_28.allocator = in_RAX;
  }
  else {
    __fn = (TParameter *)(param->name->_M_dataplus)._M_p;
    this_00 = GetThreadPoolAllocator();
    this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
    local_28.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,
               (char *)__fn,&local_28);
    in_RDX = extraout_RDX;
  }
  this->name = this_01;
  iVar1 = TType::clone(param->type,(__fn *)__fn,in_RDX,in_ECX,in_R8);
  this->type = (TType *)CONCAT44(extraout_var,iVar1);
  this->defaultValue = param->defaultValue;
  return this;
}

Assistant:

TParameter& copyParam(const TParameter& param)
    {
        if (param.name)
            name = NewPoolTString(param.name->c_str());
        else
            name = nullptr;
        type = param.type->clone();
        defaultValue = param.defaultValue;
        return *this;
    }